

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmFormatterLog::set_log_file(CVmFormatterLog *this,CVmNetFile *nf,osfildef *fp)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  CVmFormatterLog *in_stack_000000d0;
  uint local_4;
  
  iVar1 = close_log_file(in_stack_000000d0);
  if (iVar1 == 0) {
    (**(code **)(*in_RDI + 8))();
    in_RDI[0x1e08] = in_RDX;
    in_RDI[0x1e09] = in_RSI;
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int CVmFormatterLog::set_log_file(VMG_ CVmNetFile *nf, osfildef *fp)
{
    /* close any existing log file */
    if (close_log_file(vmg0_))
        return 1;

    /* reinitialize */
    init();

    /* remember the file */
    logfp_ = fp;
    lognf_ = nf;

    /* success */
    return 0;
}